

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

VariableID __thiscall spirv_cross::Compiler::build_dummy_sampler_for_combined_images(Compiler *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  undefined2 uVar5;
  Dim DVar6;
  bool bVar7;
  undefined1 uVar8;
  ImageFormat IVar9;
  AccessQualifier AVar10;
  TypeID TVar11;
  TypeID TVar12;
  uint32_t id;
  SPIRFunction *func;
  SPIRType *pSVar13;
  SPIRType *pSVar14;
  ID id_00;
  uint32_t ptr_type_id;
  DummySamplerForCombinedImageHandler handler;
  uint32_t local_70 [2];
  string local_68;
  OpcodeHandler local_48;
  Compiler *local_40;
  char local_38;
  
  local_48._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_0050c258;
  local_38 = '\0';
  local_40 = this;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_48);
  id_00.id = 0;
  if (local_38 == '\x01') {
    id = ParsedIR::increase_bound_by(&this->ir,3);
    local_70[0] = id + 1;
    id_00.id = id + 2;
    local_68._M_dataplus._M_p._0_4_ = 0x1a;
    pSVar13 = set<spirv_cross::SPIRType,spv::Op>(this,id,(Op *)&local_68);
    pSVar13->basetype = Sampler;
    local_68._M_dataplus._M_p._0_4_ = 0x20;
    pSVar14 = set<spirv_cross::SPIRType,spv::Op>(this,local_70[0],(Op *)&local_68);
    (pSVar14->super_IVariant).self.id = (pSVar13->super_IVariant).self.id;
    uVar1 = pSVar13->width;
    uVar2 = pSVar13->vecsize;
    *(undefined8 *)&(pSVar14->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar13->super_IVariant).field_0xc;
    pSVar14->width = uVar1;
    pSVar14->vecsize = uVar2;
    pSVar14->columns = pSVar13->columns;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar14->array,&pSVar13->array);
    SmallVector<bool,_8UL>::operator=(&pSVar14->array_size_literal,&pSVar13->array_size_literal);
    bVar3 = pSVar13->pointer;
    bVar4 = pSVar13->forward_pointer;
    uVar5 = *(undefined2 *)&pSVar13->field_0x7e;
    pSVar14->pointer_depth = pSVar13->pointer_depth;
    pSVar14->pointer = bVar3;
    pSVar14->forward_pointer = bVar4;
    *(undefined2 *)&pSVar14->field_0x7e = uVar5;
    pSVar14->storage = pSVar13->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar14->member_types,&pSVar13->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar14->member_type_index_redirection,&pSVar13->member_type_index_redirection);
    DVar6 = (pSVar13->image).dim;
    bVar3 = (pSVar13->image).depth;
    bVar4 = (pSVar13->image).arrayed;
    bVar7 = (pSVar13->image).ms;
    uVar8 = (pSVar13->image).field_0xb;
    uVar1 = (pSVar13->image).sampled;
    IVar9 = (pSVar13->image).format;
    AVar10 = (pSVar13->image).access;
    TVar11.id = (pSVar13->type_alias).id;
    TVar12.id = (pSVar13->parent_type).id;
    (pSVar14->image).type = (TypeID)(pSVar13->image).type.id;
    (pSVar14->image).dim = DVar6;
    (pSVar14->image).depth = bVar3;
    (pSVar14->image).arrayed = bVar4;
    (pSVar14->image).ms = bVar7;
    (pSVar14->image).field_0xb = uVar8;
    (pSVar14->image).sampled = uVar1;
    (pSVar14->image).format = IVar9;
    (pSVar14->image).access = AVar10;
    pSVar14->type_alias = (TypeID)TVar11.id;
    pSVar14->parent_type = (TypeID)TVar12.id;
    if (pSVar13 != pSVar14) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar14->member_name_cache,&(pSVar13->member_name_cache)._M_h);
    }
    (pSVar14->super_IVariant).self.id = id;
    pSVar14->storage = StorageClassUniformConstant;
    pSVar14->pointer = true;
    (pSVar14->parent_type).id = id;
    local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffff00000000;
    local_70[1] = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this,id_00.id,local_70,(StorageClass *)&local_68,(int *)(local_70 + 1));
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"SPIRV_Cross_DummySampler","");
    ParsedIR::set_name(&this->ir,id_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    this->dummy_sampler_id = id_00.id;
  }
  return (VariableID)id_00.id;
}

Assistant:

VariableID Compiler::build_dummy_sampler_for_combined_images()
{
	DummySamplerForCombinedImageHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	if (handler.need_dummy_sampler)
	{
		uint32_t offset = ir.increase_bound_by(3);
		auto type_id = offset + 0;
		auto ptr_type_id = offset + 1;
		auto var_id = offset + 2;

		auto &sampler = set<SPIRType>(type_id, OpTypeSampler);
		sampler.basetype = SPIRType::Sampler;

		auto &ptr_sampler = set<SPIRType>(ptr_type_id, OpTypePointer);
		ptr_sampler = sampler;
		ptr_sampler.self = type_id;
		ptr_sampler.storage = StorageClassUniformConstant;
		ptr_sampler.pointer = true;
		ptr_sampler.parent_type = type_id;

		set<SPIRVariable>(var_id, ptr_type_id, StorageClassUniformConstant, 0);
		set_name(var_id, "SPIRV_Cross_DummySampler");
		dummy_sampler_id = var_id;
		return var_id;
	}
	else
		return 0;
}